

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject.cc
# Opt level: O2

string * __thiscall
QPDFObject::getDescription_abi_cxx11_(string *__return_storage_ptr__,QPDFObject *this)

{
  __index_type _Var1;
  int __val;
  int __val_00;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
  *__v;
  variant_alternative_t<0UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar2;
  ulong uVar3;
  variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar4;
  ulong uVar5;
  variant_alternative_t<3UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar6;
  variant_alternative_t<1UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  *pvVar7;
  variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
  j_descr;
  shared_ptr<QPDFObject> p;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  string local_68;
  string local_48;
  
  _Var1 = *(__index_type *)
           ((long)&(this->value).
                   super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   .
                   super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
           + 0x30);
  uVar5 = 2;
  if (_Var1 != '\t') {
    uVar5 = (ulong)(_Var1 == '\b');
  }
  __v = (this->object_description).
        super___shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr;
  if (__v == (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
              *)0x0) {
    if ((this->og).obj == 0) goto switchD_00195d5a_default;
    QPDFObjGen::unparse_abi_cxx11_((string *)&j_descr,&this->og,' ');
    std::operator+(__return_storage_ptr__,"object ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_descr);
LAB_00195e28:
    pvVar4 = &j_descr;
LAB_00196086:
    std::__cxx11::string::~string((string *)pvVar4);
  }
  else {
    switch((__v->
           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           ).
           super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           .
           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
           ._M_index) {
    case '\0':
      pvVar2 = std::
               get<0ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (__v);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
      uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x2273bc);
      if (uVar3 != 0xffffffffffffffff) {
        QPDFObjGen::unparse_abi_cxx11_((string *)&j_descr,&this->og,' ');
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,(string *)0x3);
        std::__cxx11::string::~string((string *)&j_descr);
      }
      uVar3 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x22804b);
      if (uVar3 == 0xffffffffffffffff) {
        return __return_storage_ptr__;
      }
      std::__cxx11::to_string((string *)&j_descr,uVar5 + this->parsed_offset);
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar3,(string *)0x3);
      goto LAB_00195e28;
    case '\x01':
      pvVar7 = std::
               get<1ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (__v);
      JSON_Descr::JSON_Descr((JSON_Descr *)&j_descr,pvVar7);
      if (j_descr.var_descr._M_dataplus._M_p == (pointer)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"",(allocator<char> *)local_88);
      }
      else {
        std::operator+(&local_c8,", ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &j_descr.static_descr);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     j_descr.parent.super___weak_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     &local_c8);
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     " at offset ");
      std::__cxx11::to_string(&local_a8,this->parsed_offset);
      std::operator+(__return_storage_ptr__,&local_e8,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string((string *)&local_c8);
      JSON_Descr::~JSON_Descr((JSON_Descr *)&j_descr);
      break;
    case '\x02':
      pvVar4 = std::
               get<2ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (__v);
      ChildDescr::ChildDescr(&j_descr,pvVar4);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&p.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>,&j_descr);
      if (p.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
         ) {
        getDescription_abi_cxx11_
                  (&local_e8,p.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&p.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                ((string *)__return_storage_ptr__,j_descr.static_descr);
      uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x22a41c);
      if (uVar5 != 0xffffffffffffffff) {
        std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar5,(string *)0x3);
      }
      ChildDescr::~ChildDescr(&j_descr);
      break;
    case '\x03':
      pvVar6 = std::
               get<3ul,std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>
                         (__v);
      __val = pvVar6->stream_id;
      __val_00 = pvVar6->obj_id;
      if (this->qpdf == (QPDF *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&j_descr);
      }
      else {
        QPDF::getFilename_abi_cxx11_(__return_storage_ptr__,this->qpdf);
      }
      std::__cxx11::to_string((string *)local_88,__val);
      std::operator+(&local_a8," object stream ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+(&local_c8,&local_a8,", object ");
      std::__cxx11::to_string(&local_48,__val_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     &local_c8,&local_48);
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                     " 0 at offset ");
      std::__cxx11::to_string((string *)(local_88 + 0x20),uVar5 + this->parsed_offset);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&j_descr,
                     &local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_88 + 0x20));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&j_descr);
      std::__cxx11::string::~string((string *)(local_88 + 0x20));
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&p);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      pvVar4 = (variant_alternative_t<2UL,_variant<basic_string<char>,_JSON_Descr,_ChildDescr,_ObjStreamDescr>_>
                *)local_88;
      goto LAB_00196086;
    default:
switchD_00195d5a_default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObject::getDescription()
{
    qpdf_offset_t shift = (getTypeCode() == ::ot_dictionary) ? 2
        : (getTypeCode() == ::ot_array)                      ? 1
                                                             : 0;

    if (object_description) {
        switch (object_description->index()) {
        case 0:
            {
                // Simple template string
                auto description = std::get<0>(*object_description);

                if (auto pos = description.find("$OG"); pos != std::string::npos) {
                    description.replace(pos, 3, og.unparse(' '));
                }
                if (auto pos = description.find("$PO"); pos != std::string::npos) {
                    description.replace(pos, 3, std::to_string(parsed_offset + shift));
                }
                return description;
            }
        case 1:
            {
                // QPDF::JSONReactor generated description
                auto j_descr = std::get<1>(*object_description);
                return (
                    *j_descr.input + (j_descr.object.empty() ? "" : ", " + j_descr.object) +
                    " at offset " + std::to_string(parsed_offset));
            }
        case 2:
            {
                // Child object description
                auto j_descr = std::get<2>(*object_description);
                std::string result;
                if (auto p = j_descr.parent.lock()) {
                    result = p->getDescription();
                }
                result += j_descr.static_descr;
                if (auto pos = result.find("$VD"); pos != std::string::npos) {
                    result.replace(pos, 3, j_descr.var_descr);
                }
                return result;
            }
        case 3:
            auto [stream_id, obj_id] = std::get<3>(*object_description);
            std::string result = qpdf ? qpdf->getFilename() : "";
            result += " object stream " + std::to_string(stream_id) + ", object " +
                std::to_string(obj_id) + " 0 at offset " + std::to_string(parsed_offset + shift);
            return result;
        }

    } else if (og.isIndirect()) {
        return "object " + og.unparse(' ');
    }
    return {};
}